

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naivelog.cpp
# Opt level: O0

int __thiscall naivelog::get_currenttime(naivelog *this,char *datetime)

{
  tm *ptVar1;
  tm *p;
  time_t timep;
  char *datetime_local;
  naivelog *this_local;
  
  timep = (time_t)datetime;
  datetime_local = &this->enabled;
  time((time_t *)&p);
  ptVar1 = localtime((time_t *)&p);
  sprintf((char *)timep,"%4d-%02d-%02d %02d:%02d:%02d: ",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          ptVar1->tm_min,ptVar1->tm_sec);
  return 0;
}

Assistant:

int naivelog::get_currenttime(char *datetime)
{
    time_t timep;
    struct tm *p;

    time(&timep);
    p = localtime(&timep);
    sprintf(datetime, "%4d-%02d-%02d %02d:%02d:%02d: ", (1900 + p->tm_year), (1 + p->tm_mon), p->tm_mday, p->tm_hour, p->tm_min, p->tm_sec);
    return 0;
}